

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::writeIntensity(Station *this,ifstream *myfile)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  void *in_RSI;
  long in_RDI;
  double intensity;
  int j;
  int i;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_00000048;
  double in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  Station *in_stack_00000060;
  double local_20;
  int local_18;
  int local_14;
  void *local_10;
  
  local_10 = in_RSI;
  for (local_14 = 0; iVar1 = local_14, iVar2 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
      iVar1 < iVar2; local_14 = local_14 + 1) {
    for (local_18 = 0; iVar1 = local_18,
        iVar2 = Collimator::getYdim(*(Collimator **)(in_RDI + 0xb0)), iVar1 < iVar2;
        local_18 = local_18 + 1) {
      pdVar3 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
      if ((*pdVar3 != -1.0) || (NAN(*pdVar3))) {
        std::istream::operator>>(local_10,&local_20);
        local_20 = (double)((int)((local_20 + (double)*(int *)(in_RDI + 0x50) / 2.0) /
                                 (double)*(int *)(in_RDI + 0x50)) * *(int *)(in_RDI + 0x50));
        change_intensity(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050,
                         in_stack_00000048);
      }
    }
  }
  return;
}

Assistant:

void Station::writeIntensity(ifstream& myfile) {

	  for (int i=0; i<collimator.getXdim();i++) {
		  for (int j=0; j<collimator.getYdim(); j++) {
			  if(I(i,j)!=-1){
				  double intensity;
				  myfile >> intensity;
          intensity=(int) ((intensity + step_intensity/2.0)/step_intensity)*step_intensity;

				  change_intensity(i, j, (int) (intensity));
			  }
		  }
	  }
  }